

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

int Ssw_SecGeneral(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Ssw_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *p;
  Aig_Man_t *p_00;
  abctime aVar6;
  abctime clk;
  int RetValue;
  Aig_Man_t *pMiter;
  Aig_Man_t *pAigRes;
  Ssw_Pars_t *pPars_local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  
  aVar5 = Abc_Clock();
  Abc_Print(1,"Performing general verification without node pairs.\n");
  p = Saig_ManCreateMiter(pAig1,pAig2,0);
  Aig_ManCleanup(p);
  p_00 = Ssw_SignalCorrespondence(p,pPars);
  Aig_ManStop(p);
  iVar1 = Ssw_MiterStatus(p_00,1);
  if (iVar1 == 1) {
    Abc_Print(1,"Verification successful.  ");
  }
  else if (iVar1 == 0) {
    Abc_Print(1,"Verification failed with a counter-example.  ");
  }
  else {
    uVar2 = Aig_ManRegNum(p_00);
    iVar3 = Aig_ManRegNum(pAig1);
    iVar4 = Aig_ManRegNum(pAig2);
    Abc_Print(1,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
              (ulong)uVar2,(ulong)(uint)(iVar3 + iVar4));
  }
  Abc_Print(1,"%s =","Time");
  aVar6 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
  Aig_ManStop(p_00);
  return iVar1;
}

Assistant:

int Ssw_SecGeneral( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes, * pMiter;
    int RetValue;
    abctime clk = Abc_Clock();
    // try the new AIGs
    Abc_Print( 1, "Performing general verification without node pairs.\n" );
    pMiter = Saig_ManCreateMiter( pAig1, pAig2, 0 );
    Aig_ManCleanup( pMiter );
    pAigRes = Ssw_SignalCorrespondence( pMiter, pPars );
    Aig_ManStop( pMiter );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig1) + Aig_ManRegNum(pAig2) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}